

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-gettimeofday.c
# Opt level: O2

int run_test_gettimeofday(void)

{
  int iVar1;
  char *pcVar2;
  undefined8 uStack_20;
  uv_timeval64_t tv;
  
  iVar1 = uv_gettimeofday();
  if (iVar1 == 0) {
    pcVar2 = "tv.tv_sec != 0";
    uStack_20 = 0x20;
  }
  else {
    pcVar2 = "r == 0";
    uStack_20 = 0x1f;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-gettimeofday.c"
          ,uStack_20,pcVar2);
  abort();
}

Assistant:

TEST_IMPL(gettimeofday) {
  uv_timeval64_t tv;
  int r;

  tv.tv_sec = 0;
  r = uv_gettimeofday(&tv);
  ASSERT(r == 0);
  ASSERT(tv.tv_sec != 0);

  /* Test invalid input. */
  r = uv_gettimeofday(NULL);
  ASSERT(r == UV_EINVAL);

  return 0;
}